

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModel.cpp
# Opt level: O0

Result * __thiscall
CoreML::LinearModel::setOffsets
          (Result *__return_storage_ptr__,LinearModel *this,
          vector<double,_std::allocator<double>_> *offsets)

{
  bool bVar1;
  element_type *this_00;
  GLMRegressor *this_01;
  reference pdVar2;
  double n;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  GLMRegressor *lr;
  vector<double,_std::allocator<double>_> *offsets_local;
  LinearModel *this_local;
  
  this_00 = std::
            __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_Model).m_spec);
  this_01 = Specification::Model::mutable_glmregressor(this_00);
  __end1 = std::vector<double,_std::allocator<double>_>::begin(offsets);
  n = (double)std::vector<double,_std::allocator<double>_>::end(offsets);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&n);
    if (!bVar1) break;
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    Specification::GLMRegressor::add_offset(this_01,*pdVar2);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result LinearModel::setOffsets(std::vector<double> offsets) {
        auto lr = m_spec->mutable_glmregressor();
        for(double n : offsets) {
            lr->add_offset(n);
        }
        return Result();
    }